

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O2

void test_z2_standart_field_operators<Gudhi::persistence_fields::Z2_field_element>(void)

{
  byte local_622;
  persistence_fields local_621;
  undefined8 local_620;
  char *local_618;
  uint local_610 [2];
  undefined8 local_608;
  shared_count sStack_600;
  undefined **local_5f8;
  undefined1 local_5f0;
  undefined8 *local_5e8;
  char *local_5e0;
  Z2_field_element local_5d6;
  Z2_field_element local_5d5;
  Z2_field_element local_5d4;
  Z2_field_element local_5d3;
  Z2_field_element local_5d2;
  Z2_field_element local_5d1;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_622 = 1;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x89);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  local_620 = (char *)CONCAT71(local_620._1_7_,1);
  local_610[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_60,0x89,1,2,&local_620,"z21 + z22",local_610,"1");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x8a);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_578 = "";
  local_5d1.element_ = true;
  local_610[0] = 3;
  Gudhi::persistence_fields::operator+(&local_621,&local_5d1,(int *)local_610);
  local_620 = (char *)((ulong)local_620 & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_580,0x8a,1,2,&local_621,"z21 + 3",&local_620,"0");
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x8b);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_588 = "";
  local_5d2.element_ = false;
  local_610[0] = 3;
  Gudhi::persistence_fields::operator+(&local_621,&local_5d2,(int *)local_610);
  local_620._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_590,0x8b,1,2,&local_621,"z22 + 3",&local_620,"1");
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x8c);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_c8 = "";
  local_610[0] = (uint)local_622;
  local_620._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5f8,&local_d0,0x8c,1,2,local_610,"6 + z21",&local_620,"1");
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x8d);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_610[0] = 0;
  local_f8 = "";
  local_620 = (char *)((ulong)local_620._4_4_ << 0x20);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5f8,&local_100,0x8d,1,2,local_610,"6 + z22",&local_620,"0");
  local_622 = local_622 ^ 1;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x8f);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_128 = "";
  local_610[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_130,0x8f,1,2,&local_622,"z21",local_610,"0");
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x91);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_158 = "";
  local_610[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_160,0x91,1,2,&local_622,"z21",local_610,"0");
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x94);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_188 = "";
  local_620 = (char *)CONCAT71(local_620._1_7_,local_622);
  local_610[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_190,0x94,1,2,&local_620,"z21 - z22",local_610,"0");
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x95);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_598 = "";
  local_5d3.element_ = (Element)local_622;
  local_610[0] = 3;
  Gudhi::persistence_fields::operator-(&local_621,&local_5d3,(int *)local_610);
  local_620._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_5a0,0x95,1,2,&local_621,"z21 - 3",&local_620,"1");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x96);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_5a8 = "";
  local_5d4.element_ = false;
  local_610[0] = 3;
  Gudhi::persistence_fields::operator-(&local_621,&local_5d4,(int *)local_610);
  local_620._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_5b0,0x96,1,2,&local_621,"z22 - 3",&local_620,"1");
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x97);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1f8 = "";
  local_610[0] = (uint)local_622;
  local_620._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5f8,&local_200,0x97,1,2,local_610,"6 - z21",&local_620,"0");
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x98);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_610[0] = 0;
  local_228 = "";
  local_620 = (char *)((ulong)local_620._4_4_ << 0x20);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5f8,&local_230,0x98,1,2,local_610,"6 - z22",&local_620,"0");
  local_622 = local_622 ^ 1;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x9a);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_258 = "";
  local_610[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_260,0x9a,1,2,&local_622,"z21",local_610,"1");
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x9c);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_288 = "";
  local_610[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_290,0x9c,1,2,&local_622,"z21",local_610,"1");
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x9f);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2b8 = "";
  local_620 = (char *)((ulong)local_620 & 0xffffffffffffff00);
  local_610[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_2c0,0x9f,1,2,&local_620,"z21 * z22",local_610,"0");
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0xa0);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_5b8 = "";
  local_5d5.element_ = (Element)local_622;
  local_610[0] = 3;
  Gudhi::persistence_fields::operator*(&local_621,&local_5d5,(int *)local_610);
  local_620._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_5c0,0xa0,1,2,&local_621,"z21 * 3",&local_620,"1");
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0xa1);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_5c8 = "";
  local_5d6.element_ = false;
  local_610[0] = 3;
  Gudhi::persistence_fields::operator*(&local_621,&local_5d6,(int *)local_610);
  local_620._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_5d0,0xa1,1,2,&local_621,"z22 * 3",&local_620,"0");
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0xa2);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_610[0] = 0;
  local_328 = "";
  local_620._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5f8,&local_330,0xa2,1,2,local_610,"6 * z21",&local_620,"0");
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0xa3);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_610[0] = 0;
  local_358 = "";
  local_620 = (char *)((ulong)local_620._4_4_ << 0x20);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5f8,&local_360,0xa3,1,2,local_610,"6 * z22",&local_620,"0");
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0xa5);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_388 = "";
  local_610[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_390,0xa5,1,2,&local_622,"z21",local_610,"1");
  local_622 = 0;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0xa7);
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129ae8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = "";
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3b8 = "";
  local_610[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Z2_field_element,int>
            (&local_5f8,&local_3c0,0xa7,1,2,&local_622,"z21",local_610,"0");
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0xaa);
  local_610[0] = CONCAT31(local_610[0]._1_3_,local_622) ^ 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "z21 == z22";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3e8 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_3f0,0xaa,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0xab);
  local_610[0] = CONCAT31(local_610[0]._1_3_,local_622) ^ 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "z21 == 0";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_418 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_420,0xab,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0xac);
  local_610[0] = CONCAT31(local_610[0]._1_3_,local_622) ^ 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "0 == z21";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_448 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_450,0xac,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0xad);
  local_610[0]._0_1_ = 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "z22 == 0";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_478 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_480,0xad,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0xae);
  local_610[0]._0_1_ = 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "0 == z22";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4a8 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_4b0,0xae,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0xaf);
  local_610[0]._0_1_ = local_622 ^ 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "z21 != 1";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4d8 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_4e0,0xaf,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0xb0);
  local_610[0]._0_1_ = local_622 ^ 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "3 != z21";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_508 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_510,0xb0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0xb1);
  local_610[0]._0_1_ = 1;
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "z22 != 1";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_538 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_540,0xb1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0xb2);
  local_610[0] = CONCAT31(local_610[0]._1_3_,1);
  local_608 = 0;
  sStack_600.pi_ = (sp_counted_base *)0x0;
  local_620 = "3 != z22";
  local_618 = "";
  local_5f0 = 0;
  local_5f8 = &PTR__lazy_ostream_00129be8;
  local_5e8 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = (char *)&local_620;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_568 = "";
  boost::test_tools::tt_detail::report_assertion(local_610,&local_5f8,&local_570,0xb2,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_600);
  return;
}

Assistant:

void test_z2_standart_field_operators() {
  Z2 z21(7);
  Z2 z22(2);

  //+
  BOOST_CHECK_EQUAL(z21 + z22, 1);
  BOOST_CHECK_EQUAL(z21 + 3, 0);
  BOOST_CHECK_EQUAL(z22 + 3, 1);
  BOOST_CHECK_EQUAL(6 + z21, 1);
  BOOST_CHECK_EQUAL(6 + z22, 0);
  z21 += 3;
  BOOST_CHECK_EQUAL(z21, 0);
  z21 += z22;
  BOOST_CHECK_EQUAL(z21, 0);

  //-
  BOOST_CHECK_EQUAL(z21 - z22, 0);
  BOOST_CHECK_EQUAL(z21 - 3, 1);
  BOOST_CHECK_EQUAL(z22 - 3, 1);
  BOOST_CHECK_EQUAL(6 - z21, 0);
  BOOST_CHECK_EQUAL(6 - z22, 0);
  z21 -= 3;
  BOOST_CHECK_EQUAL(z21, 1);
  z21 -= z22;
  BOOST_CHECK_EQUAL(z21, 1);

  //*
  BOOST_CHECK_EQUAL(z21 * z22, 0);
  BOOST_CHECK_EQUAL(z21 * 3, 1);
  BOOST_CHECK_EQUAL(z22 * 3, 0);
  BOOST_CHECK_EQUAL(6 * z21, 0);
  BOOST_CHECK_EQUAL(6 * z22, 0);
  z21 *= 3;
  BOOST_CHECK_EQUAL(z21, 1);
  z21 *= z22;
  BOOST_CHECK_EQUAL(z21, 0);

  //==
  BOOST_CHECK(z21 == z22);
  BOOST_CHECK(z21 == 0);
  BOOST_CHECK(0 == z21);
  BOOST_CHECK(z22 == 0);
  BOOST_CHECK(0 == z22);
  BOOST_CHECK(z21 != 1);
  BOOST_CHECK(3 != z21);
  BOOST_CHECK(z22 != 1);
  BOOST_CHECK(3 != z22);
}